

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O0

CURLcode merge_duplicate_headers(curl_slist *head)

{
  int iVar1;
  CURLcode CVar2;
  char *pcVar3;
  char *val_next;
  char *colon_next;
  dynbuf buf;
  curl_slist *next;
  curl_slist *pcStack_20;
  CURLcode result;
  curl_slist *curr;
  curl_slist *head_local;
  
  pcStack_20 = head;
  while( true ) {
    while( true ) {
      if ((pcStack_20 == (curl_slist *)0x0) ||
         (buf.toobig = (size_t)pcStack_20->next, (curl_slist *)buf.toobig == (curl_slist *)0x0)) {
        return CURLE_OK;
      }
      iVar1 = compare_header_names(pcStack_20->data,((curl_slist *)buf.toobig)->data);
      if (iVar1 == 0) break;
      pcStack_20 = pcStack_20->next;
    }
    Curl_dyn_init((dynbuf *)&colon_next,0x19000);
    CVar2 = Curl_dyn_add((dynbuf *)&colon_next,pcStack_20->data);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    pcVar3 = strchr(*(char **)buf.toobig,0x3a);
    CVar2 = Curl_dyn_addn((dynbuf *)&colon_next,",",1);
    if (CVar2 != CURLE_OK) break;
    CVar2 = Curl_dyn_add((dynbuf *)&colon_next,pcVar3 + 1);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    (*Curl_cfree)(pcStack_20->data);
    pcVar3 = Curl_dyn_ptr((dynbuf *)&colon_next);
    pcStack_20->data = pcVar3;
    pcStack_20->next = *(curl_slist **)(buf.toobig + 8);
    (*Curl_cfree)(*(void **)buf.toobig);
    (*Curl_cfree)((void *)buf.toobig);
  }
  return CVar2;
}

Assistant:

static CURLcode merge_duplicate_headers(struct curl_slist *head)
{
  struct curl_slist *curr = head;
  CURLcode result = CURLE_OK;

  while(curr) {
    struct curl_slist *next = curr->next;
    if(!next)
      break;

    if(compare_header_names(curr->data, next->data) == 0) {
      struct dynbuf buf;
      char *colon_next;
      char *val_next;

      Curl_dyn_init(&buf, CURL_MAX_HTTP_HEADER);

      result = Curl_dyn_add(&buf, curr->data);
      if(result)
        return result;

      colon_next = strchr(next->data, ':');
      DEBUGASSERT(colon_next);
      val_next = colon_next + 1;

      result = Curl_dyn_addn(&buf, ",", 1);
      if(result)
        return result;

      result = Curl_dyn_add(&buf, val_next);
      if(result)
        return result;

      free(curr->data);
      curr->data = Curl_dyn_ptr(&buf);

      curr->next = next->next;
      free(next->data);
      free(next);
    }
    else {
      curr = curr->next;
    }
  }

  return CURLE_OK;
}